

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hamt_map.hpp
# Opt level: O1

void __thiscall
pstore::index::
hamt_map<pstore::uint128,_pstore::extent<unsigned_char>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>
::hamt_map(hamt_map<pstore::uint128,_pstore::extent<unsigned_char>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>
           *this,database *db,typed_address<pstore::index::header_block> pos,u128_hash *hash,
          equal_to<pstore::uint128> *equal)

{
  _func_int *p_Var1;
  _func_int *p_Var2;
  uint uVar3;
  chunked_sequence<pstore::index::details::internal_node,_10922UL,_528UL,_8UL> *this_00;
  shared_ptr<const_pstore::index::header_block> hb;
  _func_int **local_38;
  _Head_base<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_false> local_30;
  
  (this->super_index_base)._vptr_index_base = (_func_int **)&PTR__hamt_map_001364c8;
  this_00 = (chunked_sequence<pstore::index::details::internal_node,_10922UL,_528UL,_8UL> *)
            operator_new(0x20);
  chunked_sequence<pstore::index::details::internal_node,_10922UL,_528UL,_8UL>::chunked_sequence
            (this_00);
  (this->internals_container_)._M_t.
  super___uniq_ptr_impl<pstore::chunked_sequence<pstore::index::details::internal_node,_10922UL,_528UL,_8UL>,_std::default_delete<pstore::chunked_sequence<pstore::index::details::internal_node,_10922UL,_528UL,_8UL>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_pstore::chunked_sequence<pstore::index::details::internal_node,_10922UL,_528UL,_8UL>_*,_std::default_delete<pstore::chunked_sequence<pstore::index::details::internal_node,_10922UL,_528UL,_8UL>_>_>
  .
  super__Head_base<0UL,_pstore::chunked_sequence<pstore::index::details::internal_node,_10922UL,_528UL,_8UL>_*,_false>
  ._M_head_impl = this_00;
  uVar3 = database::get_current_revision(db);
  this->revision_ = uVar3;
  (this->root_).internal_ = (internal_node *)0x0;
  this->size_ = 0;
  if (pos.a_.a_ != 0) {
    database::getro<pstore::index::header_block,void>
              ((database *)&stack0xffffffffffffffc8,(typed_address<pstore::index::header_block>)db,
               (size_t)pos.a_.a_);
    if (*local_38 != (_func_int *)0x7264654878646e49) {
      raise<pstore::error_code>(index_corrupt);
    }
    p_Var1 = local_38[2];
    if ((((((ulong)p_Var1 & 2) != 0) ||
         (p_Var2 = local_38[1], (p_Var1 != (_func_int *)0x0) != (p_Var2 != (_func_int *)0x0))) ||
        (((byte)p_Var1 & p_Var2 == (_func_int *)0x1) != 0)) ||
       (((ulong)p_Var1 & 1) == 0 && (_func_int *)0x1 < p_Var2)) {
      raise<pstore::error_code>(index_corrupt);
    }
    this->size_ = (size_t)p_Var2;
    this->root_ = *(index_pointer *)(local_38 + 2);
    if (local_30._M_head_impl != (array<pstore::sat_entry,_65536UL> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_30._M_head_impl);
    }
  }
  return;
}

Assistant:

hamt_map<KeyType, ValueType, Hash, KeyEqual>::hamt_map (
            database const & db, typed_address<header_block> const pos, Hash const & hash,
            KeyEqual const & equal)
                : internals_container_{std::make_unique<internal_nodes_container> ()}
                , revision_{db.get_current_revision ()}
                , hash_{hash}
                , equal_{equal} {

            if (pos != typed_address<header_block>::null ()) {
                // 'pos' points to the index header block which gives us the tree root and size.
                std::shared_ptr<header_block const> const hb = db.getro (pos);
                // Check that this block appears to be sensible.
#if PSTORE_SIGNATURE_CHECKS_ENABLED
                if (hb->signature != index_signature) {
                    raise (pstore::error_code::index_corrupt);
                }
#endif

                {
                    auto const root = index_pointer{hb->root};
                    if (root.is_heap () || (hb->size == 0U && !root.is_empty ()) ||
                        (hb->size > 0U && root.is_empty ()) ||
                        (hb->size == 1U && !root.is_leaf ()) ||
                        (hb->size > 1U && !root.is_internal ())) {

                        raise (pstore::error_code::index_corrupt);
                    }
                }
                size_ = hb->size;
                root_ = hb->root;
            }
        }